

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void reportLp(HighsLogOptions *log_options,HighsLp *lp,HighsLogType report_level)

{
  reportLpDimensions(log_options,lp);
  reportLpObjSense(log_options,lp);
  if (1 < (int)report_level) {
    reportLpColVectors(log_options,lp);
    reportLpRowVectors(log_options,lp);
    if (report_level != kDetailed) {
      reportLpColMatrix(log_options,lp);
      return;
    }
  }
  return;
}

Assistant:

void reportLp(const HighsLogOptions& log_options, const HighsLp& lp,
              const HighsLogType report_level) {
  reportLpBrief(log_options, lp);
  if ((HighsInt)report_level >= (HighsInt)HighsLogType::kDetailed) {
    reportLpColVectors(log_options, lp);
    reportLpRowVectors(log_options, lp);
    if ((HighsInt)report_level >= (HighsInt)HighsLogType::kVerbose)
      reportLpColMatrix(log_options, lp);
  }
}